

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void add__func__def(c2m_ctx_t c2m_ctx,node_t_conflict func_block,str_t func_name)

{
  anon_union_16_10_0af5b411_for_u *list;
  tab_str_t el_00;
  int iVar1;
  node_t_conflict pnVar2;
  node_t_conflict pnVar3;
  node_t_conflict pnVar4;
  node_t_conflict pnVar5;
  node_t_conflict pnVar6;
  node_t pnVar7;
  pos_t p;
  pos_t p_00;
  tab_str_t el;
  node_t_conflict pnStack_60;
  size_t sStack_58;
  tab_str_t local_50;
  
  p_00 = get_node_pos(c2m_ctx,func_block);
  p.fname = p_00._8_8_;
  el_00.str.len = 9;
  el_00.str.s = "__func__";
  el_00.key = (size_t)pnStack_60;
  el_00.flags = sStack_58;
  iVar1 = HTAB_tab_str_t_do(c2m_ctx->str_tab,el_00,HTAB_FIND,&local_50);
  if (iVar1 != 0) {
    pnVar2 = new_node(c2m_ctx,N_LIST);
    add_pos(c2m_ctx,pnVar2,p_00);
    list = &pnVar2->u;
    pnVar3 = new_node(c2m_ctx,N_STATIC);
    add_pos(c2m_ctx,pnVar3,p_00);
    DLIST_node_t_append(&list->ops,pnVar3);
    pnVar3 = new_node(c2m_ctx,N_CONST);
    add_pos(c2m_ctx,pnVar3,p_00);
    DLIST_node_t_append(&list->ops,pnVar3);
    pnVar3 = new_node(c2m_ctx,N_CHAR);
    add_pos(c2m_ctx,pnVar3,p_00);
    DLIST_node_t_append(&list->ops,pnVar3);
    pnVar3 = new_node(c2m_ctx,N_LIST);
    add_pos(c2m_ctx,pnVar3,p_00);
    pnVar4 = new_node(c2m_ctx,N_IGNORE);
    add_pos(c2m_ctx,pnVar4,p_00);
    pnVar5 = new_node(c2m_ctx,N_LIST);
    add_pos(c2m_ctx,pnVar5,p_00);
    pnVar6 = new_node(c2m_ctx,N_IGNORE);
    add_pos(c2m_ctx,pnVar6,p_00);
    pnVar4 = new_pos_node3(c2m_ctx,N_ARR,p_00,pnVar4,pnVar5,pnVar6);
    DLIST_node_t_append(&(pnVar3->u).ops,pnVar4);
    pnVar4 = new_node(c2m_ctx,N_ID);
    add_pos(c2m_ctx,pnVar4,p_00);
    (pnVar4->u).s.s = local_50.str.s;
    (pnVar4->u).s.len = local_50.str.len;
    pnVar3 = new_node2(c2m_ctx,N_DECL,pnVar4,pnVar3);
    add_pos(c2m_ctx,pnVar3,p_00);
    pnVar4 = new_node(c2m_ctx,N_IGNORE);
    pnVar5 = new_node(c2m_ctx,N_IGNORE);
    pnVar6 = new_node(c2m_ctx,N_STR);
    add_pos(c2m_ctx,pnVar6,p_00);
    (pnVar6->u).l = (mir_long)func_name.s;
    (pnVar6->u).s.len = func_name.len;
    p._8_8_ = pnVar2;
    pnVar2 = new_pos_node5(c2m_ctx,(node_code_t)p_00.fname,p,pnVar3,pnVar4,pnVar5,pnVar6,pnStack_60)
    ;
    pnVar7 = (func_block->u).ops.head;
    if (pnVar7 != (node_t)0x0) {
      pnVar7 = (pnVar7->op_link).next;
    }
    DLIST_node_t_prepend(&(pnVar7->u).ops,pnVar2);
  }
  return;
}

Assistant:

static void add__func__def (c2m_ctx_t c2m_ctx, node_t func_block, str_t func_name) {
  static const char fdecl_name[] = "__func__";
  pos_t pos = POS (func_block);
  node_t list, declarator, decl, decl_specs;
  tab_str_t str;

  if (!str_exists_p (c2m_ctx, fdecl_name, strlen (fdecl_name) + 1, &str)) return;
  decl_specs = new_pos_node (c2m_ctx, N_LIST, pos);
  NL_APPEND (decl_specs->u.ops, new_pos_node (c2m_ctx, N_STATIC, pos));
  NL_APPEND (decl_specs->u.ops, new_pos_node (c2m_ctx, N_CONST, pos));
  NL_APPEND (decl_specs->u.ops, new_pos_node (c2m_ctx, N_CHAR, pos));
  list = new_pos_node (c2m_ctx, N_LIST, pos);
  NL_APPEND (list->u.ops, new_pos_node3 (c2m_ctx, N_ARR, pos, new_pos_node (c2m_ctx, N_IGNORE, pos),
                                         new_pos_node (c2m_ctx, N_LIST, pos),
                                         new_pos_node (c2m_ctx, N_IGNORE, pos)));
  declarator
    = new_pos_node2 (c2m_ctx, N_DECL, pos, new_str_node (c2m_ctx, N_ID, str.str, pos), list);
  decl = new_pos_node5 (c2m_ctx, N_SPEC_DECL, pos, decl_specs, declarator,
                        new_node (c2m_ctx, N_IGNORE), new_node (c2m_ctx, N_IGNORE),
                        new_str_node (c2m_ctx, N_STR, func_name, pos));
  NL_PREPEND (NL_EL (func_block->u.ops, 1)->u.ops, decl);
}